

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStructTests.cpp
# Opt level: O1

void deqp::gles2::Functional::anon_unknown_7::setUniform
               (Functions *gl,deUint32 programID,char *name,Vec3 *vec)

{
  GLint GVar1;
  GLenum err;
  long *plVar2;
  long *plVar3;
  long *local_60;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  GVar1 = (*gl->getUniformLocation)(programID,name);
  (*gl->uniform3fv)(GVar1,1,vec->m_data);
  err = (*gl->getError)();
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Failed to set ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_40);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  glu::checkError(err,(char *)local_60,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderStructTests.cpp"
                  ,0x4a6);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void setUniform (const glw::Functions& gl, deUint32 programID, const char* name, float value)
{
	int loc = gl.getUniformLocation(programID, name);
	gl.uniform1f(loc, value);
	CHECK_SET_UNIFORM(name);
}